

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void __thiscall iqnet::ssl::LockContainer::~LockContainer(LockContainer *this)

{
  mutex *pmVar1;
  long lVar2;
  mutex *this_00;
  LockContainer *this_local;
  
  pmVar1 = this->locks;
  if (pmVar1 != (mutex *)0x0) {
    lVar2 = *(long *)((long)&pmVar1[-1].m + 0x20);
    this_00 = pmVar1 + lVar2;
    while (pmVar1 != this_00) {
      this_00 = this_00 + -1;
      boost::mutex::~mutex(this_00);
    }
    operator_delete__((void *)((long)&pmVar1[-1].m + 0x20),lVar2 * 0x28 + 8);
  }
  return;
}

Assistant:

LockContainer::~LockContainer()
{
   if (CRYPTO_get_locking_callback() == &openssl_lock_callback)
    CRYPTO_set_locking_callback(0);

#ifndef _WIN32
  if (CRYPTO_get_id_callback() == &openssl_id_function)
    CRYPTO_set_id_callback(0);
#endif

  // do not try to unlock locks
  delete[] locks;
}